

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_i_refvec.h
# Opt level: O0

i_refvec<double_*> * __thiscall
TNT::i_refvec<double_*>::operator=(i_refvec<double_*> *this,i_refvec<double_*> *V)

{
  i_refvec<double_*> *V_local;
  i_refvec<double_*> *this_local;
  
  if (this != V) {
    if ((this->ref_count_ != (int *)0x0) &&
       (*this->ref_count_ = *this->ref_count_ + -1, *this->ref_count_ == 0)) {
      destroy(this);
    }
    this->data_ = V->data_;
    this->ref_count_ = V->ref_count_;
    if (V->ref_count_ != (int *)0x0) {
      *V->ref_count_ = *V->ref_count_ + 1;
    }
  }
  return this;
}

Assistant:

i_refvec<T> & i_refvec<T>::operator=(const i_refvec<T> &V)
{
	if (this == &V)
		return *this;


	if (ref_count_ != NULL)
	{
		(*ref_count_) --;
		if ((*ref_count_) == 0)
			destroy();
	}

	data_ = V.data_;
	ref_count_ = V.ref_count_;

	if (V.ref_count_ != NULL)
	    (*(V.ref_count_))++;

	return *this;
}